

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

quaternion * quaternion_multiplyv3(quaternion *self,vector3 *vT)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = (self->field_0).q[0];
  dVar4 = (vT->field_0).v[0];
  dVar5 = (vT->field_0).v[1];
  dVar2 = (vT->field_0).v[2];
  dVar3 = (self->field_0).q[3];
  dVar6 = (self->field_0).q[1];
  dVar7 = (self->field_0).q[2];
  (self->field_0).q[0] = -dVar7 * dVar5 + dVar3 * dVar4 + dVar6 * dVar2;
  (self->field_0).q[1] = dVar7 * dVar4 + dVar3 * dVar5 + -dVar1 * dVar2;
  (self->field_0).q[2] = (dVar2 * dVar3 + dVar5 * dVar1) - dVar4 * dVar6;
  (self->field_0).q[3] = (dVar4 * dVar1 + dVar5 * -dVar6) - dVar2 * dVar7;
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_multiplyv3(struct quaternion *self, const struct vector3 *vT)
{
	/* vT is the multiplicand */

	struct quaternion r;

	r.x = self->w * vT->x + self->y * vT->z - self->z * vT->y;
	r.y = self->w * vT->y - self->x * vT->z + self->z * vT->x;
	r.z = self->w * vT->z + self->x * vT->y - self->y * vT->x;
	r.w = self->x * vT->x - self->y * vT->y - self->z * vT->z;

	quaternion_set(self, &r); /* overwrite/save it */

	return self;
}